

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O0

void ppMulEq(word *c,word *a,word *b,size_t n,void *stack)

{
  ulong uVar1;
  word *in_RCX;
  long lVar2;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  void *in_R8;
  size_t i_1;
  size_t m_1;
  word *t_1;
  size_t i;
  size_t m;
  word *t;
  long local_58;
  ulong local_40;
  void *in_stack_ffffffffffffffd0;
  void *pvVar3;
  
  if (in_RCX < (word *)0xa) {
    (*_mul_procs[(long)in_RCX])(in_RDI,in_RSI,in_RDX,in_R8);
  }
  else if (((ulong)in_RCX & 1) == 0) {
    uVar1 = (ulong)in_RCX >> 1;
    pvVar3 = in_R8;
    ppMulEq(in_RSI,in_RDX,in_RCX,(size_t)in_R8,in_R8);
    ppMulEq(in_RSI,in_RDX,in_RCX,(size_t)pvVar3,in_R8);
    for (local_40 = 0; local_40 < uVar1; local_40 = local_40 + 1) {
      *(word *)((long)in_R8 + local_40 * 8) = in_RSI[local_40] ^ in_RSI[uVar1 + local_40];
      *(word *)((long)in_R8 + (uVar1 + local_40) * 8) = in_RDX[local_40] ^ in_RDX[uVar1 + local_40];
      *(word *)((long)in_R8 + (uVar1 * 2 + local_40) * 8) =
           in_RDI[uVar1 + local_40] ^ in_RDI[uVar1 * 2 + local_40];
    }
    ppMulEq(in_RSI,in_RDX,in_RCX,(size_t)pvVar3,in_R8);
    for (local_40 = 0; local_40 < uVar1; local_40 = local_40 + 1) {
      in_RDI[uVar1 + local_40] =
           in_RDI[local_40] ^ *(ulong *)((long)in_R8 + (uVar1 * 2 + local_40) * 8) ^
           in_RDI[uVar1 + local_40];
      lVar2 = uVar1 * 2 + local_40;
      in_RDI[lVar2] =
           in_RDI[uVar1 * 3 + local_40] ^ *(ulong *)((long)in_R8 + (uVar1 * 2 + local_40) * 8) ^
           in_RDI[lVar2];
    }
  }
  else {
    uVar1 = (long)in_RCX + 1U >> 1;
    pvVar3 = in_R8;
    ppMulEq(in_RSI,in_RDX,in_RCX,(size_t)in_R8,in_stack_ffffffffffffffd0);
    ppMulEq(in_RSI,in_RDX,in_RCX,(size_t)pvVar3,in_stack_ffffffffffffffd0);
    for (local_58 = 0; local_58 + 1U < uVar1; local_58 = local_58 + 1) {
      *(word *)((long)in_R8 + local_58 * 8) = in_RSI[local_58] ^ in_RSI[uVar1 + local_58];
      *(word *)((long)in_R8 + (uVar1 + local_58) * 8) = in_RDX[local_58] ^ in_RDX[uVar1 + local_58];
      *(word *)((long)in_R8 + (uVar1 * 2 + local_58) * 8) =
           in_RDI[uVar1 + local_58] ^ in_RDI[uVar1 * 2 + local_58];
    }
    *(word *)((long)in_R8 + local_58 * 8) = in_RSI[local_58];
    *(word *)((long)in_R8 + (uVar1 + local_58) * 8) = in_RDX[local_58];
    *(word *)((long)in_R8 + (uVar1 * 2 + local_58) * 8) =
         in_RDI[uVar1 + local_58] ^ in_RDI[uVar1 * 2 + local_58];
    ppMulEq(in_RSI,in_RDX,in_RCX,(size_t)pvVar3,in_stack_ffffffffffffffd0);
    for (local_58 = 0; local_58 + 2U < uVar1; local_58 = local_58 + 1) {
      in_RDI[uVar1 + local_58] =
           in_RDI[local_58] ^ *(ulong *)((long)in_R8 + (uVar1 * 2 + local_58) * 8) ^
           in_RDI[uVar1 + local_58];
      lVar2 = uVar1 * 2 + local_58;
      in_RDI[lVar2] =
           in_RDI[uVar1 * 3 + local_58] ^ *(ulong *)((long)in_R8 + (uVar1 * 2 + local_58) * 8) ^
           in_RDI[lVar2];
    }
    in_RDI[uVar1 + local_58] =
         in_RDI[local_58] ^ *(ulong *)((long)in_R8 + (uVar1 * 2 + local_58) * 8) ^
         in_RDI[uVar1 + local_58];
    lVar2 = uVar1 * 2 + local_58;
    in_RDI[lVar2] = *(ulong *)((long)in_R8 + (uVar1 * 2 + local_58) * 8) ^ in_RDI[lVar2];
    local_58 = local_58 + 1;
    in_RDI[uVar1 + local_58] =
         in_RDI[local_58] ^ *(ulong *)((long)in_R8 + (uVar1 * 2 + local_58) * 8) ^
         in_RDI[uVar1 + local_58];
    lVar2 = uVar1 * 2 + local_58;
    in_RDI[lVar2] = *(ulong *)((long)in_R8 + (uVar1 * 2 + local_58) * 8) ^ in_RDI[lVar2];
  }
  return;
}

Assistant:

static void ppMulEq(word c[], const word a[], const word b[], size_t n,
	void* stack)
{
	ASSERT(wwIsDisjoint2(a, n, c, 2 * n));
	ASSERT(wwIsDisjoint2(b, n, c, 2 * n));
	// умножение многочленов малой длины
	if (n < COUNT_OF(_mul_procs))
		_mul_procs[n](c, a, b, stack);
	// усеченный алгоритм Карацубы, n --- четное
	else if ((n & 1) == 0)
	{
		word* t = (word*)stack;
		size_t m = n / 2, i;
		// c1 || c0 <- a0 b0
		ppMulEq(c, a, b, m, t);
		// c3 || c2 <- a1 b1
		ppMulEq(c + 2 * m, a + m, b + m, m, t);
		// t0 <- a0 + a1, t1 <- b0 + b1, t2 <- c1 + c2
		for (i = 0; i < m; ++i)
			t[i] = a[i] ^ a[m + i],
			t[m + i] = b[i] ^ b[m + i],
			t[2 * m + i] = c[m + i] ^ c[2 * m + i];
		// c2 || c1 <- t0 t1
		ppMulEq(c + m, t, t + m, m, t + 3 * m);
		// c1 <- c1 + c0 + t2, c2 <- c2 + c3 + t2
		for (i = 0; i < m; ++i)
			c[m + i] ^= c[i] ^ t[2 * m + i],
			c[2 * m + i] ^= c[3 * m + i] ^ t[2 * m + i];
	}
	// усеченный алгоритм Карацубы, n --- нечетное
	else
	{
		word* t = (word*)stack;
		size_t m = (n + 1) / 2, i;
		// c1 || c0 <- a0 b0
		ppMulEq(c, a, b, m, t);
		// c3 || c2 <- a1 b1
		ppMulEq(c + 2 * m, a + m, b + m, n - m, t);
		// t0 <- a0 + a1, t1 <- b0 + b1, t2 <- c1 + c2
		for (i = 0; i + 1 < m; ++i)
			t[i] = a[i] ^ a[m + i],
			t[m + i] = b[i] ^ b[m + i],
			t[2 * m + i] = c[m + i] ^ c[2 * m + i];
		t[i] = a[i];
		t[m + i] = b[i];
		t[2 * m + i] = c[m + i] ^ c[2 * m + i];
		// c2 || c1 <- t0 t1
		ppMulEq(c + m, t, t + m, m, t + 3 * m);
		// c1 <- c1 + c0 + t2, c2 <- c2 + c3 + t2
		for (i = 0; i + 2 < m; ++i)
			c[m + i] ^= c[i] ^ t[2 * m + i],
			c[2 * m + i] ^= c[3 * m + i] ^ t[2 * m + i];
		c[m + i] ^= c[i] ^ t[2 * m + i];
		c[2 * m + i] ^= t[2 * m + i];
		++i;
		c[m + i] ^= c[i] ^ t[2 * m + i];
		c[2 * m + i] ^= t[2 * m + i];
	}
}